

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O1

int hts_idx_push(hts_idx_t *idx,int tid,int beg,int end,uint64_t offset,int is_mapped)

{
  byte bVar1;
  khint32_t key;
  uint64_t uVar2;
  kh_bin_t *pkVar3;
  uint64_t uVar4;
  uint uVar5;
  int iVar6;
  khint_t kVar7;
  bidx_t **ppbVar8;
  lidx_t *plVar9;
  bidx_t *pbVar10;
  uint64_t *puVar11;
  hts_pair64_t *phVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  bins_t *pbVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  uint32_t uVar20;
  long lVar21;
  int iVar22;
  int absent;
  int absent_1;
  int absent_2;
  int local_3c;
  int local_38;
  int local_34;
  
  uVar17 = (ulong)(uint)tid;
  iVar22 = 0;
  if (-1 < tid) {
    iVar22 = end;
  }
  iVar19 = -1;
  if (-1 < tid) {
    iVar19 = beg;
  }
  iVar15 = idx->m;
  lVar21 = (long)iVar15;
  if (iVar15 <= tid) {
    iVar6 = 2;
    if (iVar15 != 0) {
      iVar6 = iVar15 * 2;
    }
    idx->m = iVar6;
    ppbVar8 = (bidx_t **)realloc(idx->bidx,(long)iVar6 << 3);
    idx->bidx = ppbVar8;
    plVar9 = (lidx_t *)realloc(idx->lidx,(long)idx->m << 4);
    idx->lidx = plVar9;
    memset(idx->bidx + lVar21,0,(idx->m - lVar21) * 8);
    memset(idx->lidx + lVar21,0,(idx->m - lVar21) * 0x10);
  }
  if (idx->n <= tid) {
    idx->n = tid + 1;
  }
  if ((idx->z).finished != 0) {
    return 0;
  }
  iVar15 = (idx->z).last_tid;
  if ((iVar15 == tid) && (-1 < tid || iVar15 < 0)) {
    if ((-1 < tid) && (iVar19 < (idx->z).last_coor)) {
      if (hts_verbose < 1) {
        return -1;
      }
      hts_idx_push_cold_1();
      return -1;
    }
  }
  else {
    if (-1 < tid) {
      if (idx->n_no_coor != 0) {
        if (hts_verbose < 1) {
          return -1;
        }
        fprintf(_stderr,"[E::%s] NO_COOR reads not in a single block at the end %d %d\n",
                "hts_idx_push",uVar17);
        return -1;
      }
      if (idx->bidx[uVar17] != (bidx_t *)0x0) {
        if (hts_verbose < 1) {
          return -1;
        }
        hts_idx_push_cold_2();
        return -1;
      }
    }
    (idx->z).last_tid = tid;
    (idx->z).last_bin = 0xffffffff;
  }
  if (tid < 0) {
    idx->n_no_coor = idx->n_no_coor + 1;
  }
  else {
    ppbVar8 = idx->bidx;
    if (ppbVar8[uVar17] == (bidx_t *)0x0) {
      pbVar10 = (bidx_t *)calloc(1,0x28);
      ppbVar8[uVar17] = pbVar10;
    }
    if (is_mapped != 0) {
      bVar1 = (byte)idx->min_shift;
      lVar21 = (long)iVar19 >> (bVar1 & 0x3f);
      plVar9 = idx->lidx + uVar17;
      uVar2 = (idx->z).last_off;
      iVar15 = idx->lidx[uVar17].m;
      uVar14 = (uint)((long)iVar22 + -1 >> (bVar1 & 0x3f));
      if (iVar15 <= (int)uVar14) {
        uVar5 = (int)uVar14 >> 1 | uVar14;
        uVar5 = (int)uVar5 >> 2 | uVar5;
        uVar5 = (int)uVar5 >> 4 | uVar5;
        uVar5 = (int)uVar5 >> 8 | uVar5;
        uVar5 = (int)uVar5 >> 0x10 | uVar5;
        plVar9->m = uVar5 + 1;
        puVar11 = (uint64_t *)realloc(plVar9->offset,(long)(int)uVar5 * 8 + 8);
        plVar9->offset = puVar11;
        memset(puVar11 + iVar15,0xff,((long)plVar9->m - (long)iVar15) * 8);
      }
      uVar5 = (uint)lVar21;
      if (uVar5 == uVar14) {
        if (plVar9->offset[lVar21] == 0xffffffffffffffff) {
          plVar9->offset[lVar21] = uVar2;
        }
      }
      else if ((int)uVar5 <= (int)uVar14) {
        puVar11 = plVar9->offset;
        lVar13 = 0;
        do {
          if (puVar11[lVar21 + lVar13] == 0xffffffffffffffff) {
            puVar11[lVar21 + lVar13] = uVar2;
          }
          lVar13 = lVar13 + 1;
        } while ((uVar14 - uVar5) + 1 != (int)lVar13);
      }
      if (plVar9->n <= (int)uVar14) {
        plVar9->n = uVar14 + 1;
      }
    }
  }
  iVar15 = idx->n_lvls;
  uVar20 = 0;
  if (0 < iVar15) {
    iVar6 = idx->min_shift;
    uVar17 = (ulong)(uint)~(-1 << ((char)iVar15 * '\x03' & 0x1fU)) * 0x92492493 >> 0x22;
    iVar18 = iVar15 + 1;
    iVar15 = iVar15 * 3;
    do {
      iVar15 = iVar15 + -3;
      lVar21 = (long)iVar19 >> ((byte)iVar6 & 0x3f);
      if (lVar21 == (long)iVar22 + -1 >> ((byte)iVar6 & 0x3f)) {
        uVar20 = (int)uVar17 + (int)lVar21;
        break;
      }
      iVar6 = iVar6 + 3;
      uVar17 = (ulong)(uint)((int)uVar17 + (-1 << ((byte)iVar15 & 0x1f)));
      iVar18 = iVar18 + -1;
      uVar20 = 0;
    } while (1 < iVar18);
  }
  if ((idx->z).last_bin != uVar20) {
    key = (idx->z).save_bin;
    if (key != 0xffffffff) {
      uVar2 = (idx->z).last_off;
      pkVar3 = idx->bidx[(idx->z).save_tid];
      uVar4 = (idx->z).save_off;
      kVar7 = kh_put_bin(pkVar3,key,&local_3c);
      pbVar16 = pkVar3->vals + kVar7;
      if (local_3c != 0) {
        pbVar16->m = 1;
        pbVar16->n = 0;
        phVar12 = (hts_pair64_t *)calloc(1,0x10);
        pbVar16->list = phVar12;
      }
      if (pbVar16->n == pbVar16->m) {
        iVar22 = pbVar16->m * 2;
        pbVar16->m = iVar22;
        phVar12 = (hts_pair64_t *)realloc(pbVar16->list,(long)iVar22 << 4);
        pbVar16->list = phVar12;
      }
      phVar12 = pbVar16->list;
      iVar22 = pbVar16->n;
      phVar12[iVar22].u = uVar4;
      pbVar16->n = iVar22 + 1;
      phVar12[iVar22].v = uVar2;
    }
    if (((idx->z).last_bin == 0xffffffff) && ((idx->z).save_bin != 0xffffffff)) {
      uVar2 = (idx->z).last_off;
      (idx->z).off_end = uVar2;
      pkVar3 = idx->bidx[(idx->z).save_tid];
      uVar4 = (idx->z).off_beg;
      kVar7 = kh_put_bin(pkVar3,idx->n_bins + 1,&local_38);
      pbVar16 = pkVar3->vals + kVar7;
      if (local_38 != 0) {
        pbVar16->m = 1;
        pbVar16->n = 0;
        phVar12 = (hts_pair64_t *)calloc(1,0x10);
        pbVar16->list = phVar12;
      }
      if (pbVar16->n == pbVar16->m) {
        iVar22 = pbVar16->m * 2;
        pbVar16->m = iVar22;
        phVar12 = (hts_pair64_t *)realloc(pbVar16->list,(long)iVar22 << 4);
        pbVar16->list = phVar12;
      }
      phVar12 = pbVar16->list;
      iVar22 = pbVar16->n;
      phVar12[iVar22].u = uVar4;
      pbVar16->n = iVar22 + 1;
      phVar12[iVar22].v = uVar2;
      pkVar3 = idx->bidx[(idx->z).save_tid];
      uVar2 = (idx->z).n_mapped;
      uVar4 = (idx->z).n_unmapped;
      kVar7 = kh_put_bin(pkVar3,idx->n_bins + 1,&local_34);
      pbVar16 = pkVar3->vals + kVar7;
      if (local_34 != 0) {
        pbVar16->m = 1;
        pbVar16->n = 0;
        phVar12 = (hts_pair64_t *)calloc(1,0x10);
        pbVar16->list = phVar12;
      }
      if (pbVar16->n == pbVar16->m) {
        iVar22 = pbVar16->m * 2;
        pbVar16->m = iVar22;
        phVar12 = (hts_pair64_t *)realloc(pbVar16->list,(long)iVar22 << 4);
        pbVar16->list = phVar12;
      }
      phVar12 = pbVar16->list;
      iVar22 = pbVar16->n;
      phVar12[iVar22].u = uVar2;
      pbVar16->n = iVar22 + 1;
      phVar12[iVar22].v = uVar4;
      (idx->z).n_mapped = 0;
      (idx->z).n_unmapped = 0;
      (idx->z).off_beg = (idx->z).off_end;
    }
    (idx->z).save_off = (idx->z).last_off;
    (idx->z).last_bin = uVar20;
    (idx->z).save_bin = uVar20;
    (idx->z).save_tid = tid;
  }
  puVar11 = &(idx->z).n_mapped + (is_mapped == 0);
  *puVar11 = *puVar11 + 1;
  (idx->z).last_off = offset;
  (idx->z).last_coor = iVar19;
  return 0;
}

Assistant:

int hts_idx_push(hts_idx_t *idx, int tid, int beg, int end, uint64_t offset, int is_mapped)
{
    int bin;
    if (tid<0) beg = -1, end = 0;
    if (tid >= idx->m) { // enlarge the index
        int32_t oldm = idx->m;
        idx->m = idx->m? idx->m<<1 : 2;
        idx->bidx = (bidx_t**)realloc(idx->bidx, idx->m * sizeof(bidx_t*));
        idx->lidx = (lidx_t*) realloc(idx->lidx, idx->m * sizeof(lidx_t));
        memset(&idx->bidx[oldm], 0, (idx->m - oldm) * sizeof(bidx_t*));
        memset(&idx->lidx[oldm], 0, (idx->m - oldm) * sizeof(lidx_t));
    }
    if (idx->n < tid + 1) idx->n = tid + 1;
    if (idx->z.finished) return 0;
    if (idx->z.last_tid != tid || (idx->z.last_tid >= 0 && tid < 0)) { // change of chromosome
        if ( tid>=0 && idx->n_no_coor )
        {
            if (hts_verbose >= 1) fprintf(stderr,"[E::%s] NO_COOR reads not in a single block at the end %d %d\n", __func__, tid,idx->z.last_tid);
            return -1;
        }
        if (tid>=0 && idx->bidx[tid] != 0)
        {
            if (hts_verbose >= 1) fprintf(stderr, "[E::%s] chromosome blocks not continuous\n", __func__);
            return -1;
        }
        idx->z.last_tid = tid;
        idx->z.last_bin = 0xffffffffu;
    } else if (tid >= 0 && idx->z.last_coor > beg) { // test if positions are out of order
        if (hts_verbose >= 1) fprintf(stderr, "[E::%s] unsorted positions\n", __func__);
        return -1;
    }
    if ( tid>=0 )
    {
        if (idx->bidx[tid] == 0) idx->bidx[tid] = kh_init(bin);
        if ( is_mapped)
            insert_to_l(&idx->lidx[tid], beg, end, idx->z.last_off, idx->min_shift); // last_off points to the start of the current record
    }
    else idx->n_no_coor++;
    bin = hts_reg2bin(beg, end, idx->min_shift, idx->n_lvls);
    if ((int)idx->z.last_bin != bin) { // then possibly write the binning index
        if (idx->z.save_bin != 0xffffffffu) // save_bin==0xffffffffu only happens to the first record
            insert_to_b(idx->bidx[idx->z.save_tid], idx->z.save_bin, idx->z.save_off, idx->z.last_off);
        if (idx->z.last_bin == 0xffffffffu && idx->z.save_bin != 0xffffffffu) { // change of chr; keep meta information
            idx->z.off_end = idx->z.last_off;
            insert_to_b(idx->bidx[idx->z.save_tid], META_BIN(idx), idx->z.off_beg, idx->z.off_end);
            insert_to_b(idx->bidx[idx->z.save_tid], META_BIN(idx), idx->z.n_mapped, idx->z.n_unmapped);
            idx->z.n_mapped = idx->z.n_unmapped = 0;
            idx->z.off_beg = idx->z.off_end;
        }
        idx->z.save_off = idx->z.last_off;
        idx->z.save_bin = idx->z.last_bin = bin;
        idx->z.save_tid = tid;
    }
    if (is_mapped) ++idx->z.n_mapped;
    else ++idx->z.n_unmapped;
    idx->z.last_off = offset;
    idx->z.last_coor = beg;
    return 0;
}